

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
     ::run(Matrix<double,__1,_1,_0,__1,_1> *dst,SrcXprType *src,assign_op<double,_double> *param_3)

{
  long rows;
  
  rows = (((src->m_lhs).m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
         .m_storage.m_cols;
  if ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != rows
     ) {
    PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows,1);
  }
  generic_product_impl_base<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::internal::generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>>
  ::evalTo<Eigen::Matrix<double,_1,1,0,_1,1>>(dst,&src->m_lhs,src->m_rhs);
  return;
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }